

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine.cpp
# Opt level: O1

void qGeomCalc(QList<QLayoutStruct> *chain,int start,int count,int pos,int space,int spacer)

{
  undefined1 *puVar1;
  uint uVar2;
  bool bVar3;
  void *pvVar4;
  int iVar5;
  pointer pQVar6;
  long lVar7;
  long lVar8;
  int *args;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  long lVar22;
  long lVar23;
  long in_FS_OFFSET;
  bool bVar24;
  QVarLengthArray<int,_32LL> minimumSizes;
  uint local_164;
  int local_158;
  ulong local_140;
  int local_138;
  int local_128;
  int local_124;
  int local_104;
  int local_d4;
  QVLABase<int> local_d0;
  undefined1 local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = count + start;
  if (count < 1) {
    bVar21 = 1;
    local_128 = 0;
    uVar2 = 0;
    local_158 = 0;
    local_164 = 0;
    iVar11 = 0;
    iVar13 = 0;
  }
  else {
    lVar17 = (long)start;
    lVar20 = lVar17 << 5;
    iVar15 = -1;
    bVar21 = 1;
    iVar13 = 0;
    iVar11 = 0;
    local_164 = 0;
    local_158 = 0;
    uVar2 = 0;
    local_128 = 0;
    do {
      pQVar6 = QList<QLayoutStruct>::data(chain);
      (&pQVar6->done)[lVar20] = false;
      iVar16 = *(int *)((long)&pQVar6->stretch + lVar20);
      if ((&pQVar6->empty)[lVar20] == false) {
        bVar24 = -1 < iVar15;
        if (!bVar24) {
          iVar15 = 0;
        }
        iVar14 = spacer;
        if (spacer < 0) {
          iVar14 = *(int *)((long)&pQVar6->spacing + lVar20);
        }
        local_128 = local_128 + (uint)bVar24;
        local_158 = local_158 + iVar15;
        iVar15 = iVar14;
      }
      iVar13 = iVar13 + *(int *)((long)&pQVar6->sizeHint + (ulong)(0 < iVar16) * 8 + lVar20);
      iVar11 = iVar11 + *(int *)((long)&pQVar6->minimumSize + lVar20);
      if ((bVar21 & (&pQVar6->empty)[lVar20]) == 1) {
        bVar21 = ((&pQVar6->expansive)[lVar20] ^ 1U) & iVar16 < 1;
      }
      else {
        bVar21 = 0;
      }
      local_164 = local_164 + iVar16;
      uVar2 = uVar2 + (&pQVar6->expansive)[lVar20];
      lVar17 = lVar17 + 1;
      lVar20 = lVar20 + 0x20;
    } while (lVar17 < iVar5);
  }
  iVar11 = iVar11 + local_158;
  if (space < iVar11) {
    if (-1 < spacer) {
      if (iVar11 < 1) {
        spacer = 0;
      }
      else {
        spacer = (spacer * space) / iVar11;
      }
      local_158 = spacer * local_128;
    }
    memset(&local_d0,0xaa,0x98);
    local_d0.super_QVLABaseBase.a = 0x20;
    local_d0.super_QVLABaseBase.s = 0;
    local_d0.super_QVLABaseBase.ptr = local_b8;
    if (0x20 < count) {
      QVLABase<int>::reallocate_impl(&local_d0,0x20,local_b8,0,(ulong)(uint)count);
    }
    if (0 < count) {
      lVar17 = (long)start;
      uVar19 = lVar17 << 5 | 0xc;
      do {
        args = (int *)((long)&((chain->d).ptr)->stretch + uVar19);
        if (local_d0.super_QVLABaseBase.s == local_d0.super_QVLABaseBase.a) {
          local_d4 = *args;
          QVLABase<int>::emplace_back_impl<int>(&local_d0,0x20,local_b8,&local_d4);
        }
        else {
          QVLABase<int>::emplace_back_impl<int_const&>(&local_d0,0x20,local_b8,args);
        }
        lVar17 = lVar17 + 1;
        uVar19 = uVar19 + 0x20;
      } while (lVar17 < iVar5);
    }
    pvVar4 = local_d0.super_QVLABaseBase.ptr;
    if (local_d0.super_QVLABaseBase.s != 0) {
      puVar1 = (undefined1 *)
               ((long)local_d0.super_QVLABaseBase.ptr + local_d0.super_QVLABaseBase.s * 4);
      lVar17 = 0x3f;
      if (local_d0.super_QVLABaseBase.s != 0) {
        for (; (ulong)local_d0.super_QVLABaseBase.s >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_d0.super_QVLABaseBase.ptr,puVar1,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar4,puVar1);
    }
    local_158 = space - local_158;
    iVar13 = 0;
    if (count < 1) {
      iVar11 = 0;
      iVar15 = 0;
    }
    else {
      iVar11 = 0;
      iVar15 = 0;
      iVar13 = 0;
      if (0 < local_158) {
        uVar19 = 0;
        iVar16 = 0;
        iVar15 = count;
        do {
          iVar13 = *(int *)((long)local_d0.super_QVLABaseBase.ptr + uVar19 * 4);
          iVar11 = iVar13 * iVar15 + iVar16;
          uVar19 = uVar19 + 1;
          if ((uint)count <= uVar19) break;
          iVar16 = iVar16 + iVar13;
          iVar15 = iVar15 + -1;
        } while (iVar11 < local_158);
        iVar15 = -(int)uVar19;
      }
    }
    iVar15 = count + iVar15 + 1;
    uVar19 = (long)(iVar11 - local_158) % (long)iVar15;
    if (0 < count) {
      lVar17 = (long)start;
      uVar18 = lVar17 << 5 | 0x1c;
      iVar16 = 0;
      local_140 = uVar19 & 0xffffffff;
      do {
        iVar16 = iVar16 + (int)uVar19;
        iVar14 = 0;
        if (iVar15 <= iVar16) {
          iVar14 = iVar15;
        }
        iVar9 = (iVar13 - (iVar11 - local_158) / iVar15) - (uint)(iVar15 <= iVar16);
        iVar16 = iVar16 - iVar14;
        pQVar6 = QList<QLayoutStruct>::data(chain);
        iVar14 = *(int *)((long)pQVar6 + (uVar18 - 0x10));
        if (iVar14 < iVar9) {
          iVar9 = iVar14;
        }
        *(int *)((long)&pQVar6->stretch + uVar18) = iVar9;
        *(undefined1 *)((long)pQVar6 + (uVar18 - 6)) = 1;
        lVar17 = lVar17 + 1;
        uVar18 = uVar18 + 0x20;
        uVar19 = local_140;
      } while (lVar17 < iVar5);
    }
    if ((undefined1 *)local_d0.super_QVLABaseBase.ptr != local_b8) {
      QtPrivate::sizedFree(local_d0.super_QVLABaseBase.ptr,local_d0.super_QVLABaseBase.a << 2);
    }
    local_158 = 0;
    local_104 = spacer;
  }
  else {
    local_104 = spacer;
    if (space < iVar13 + local_158) {
      iVar11 = count;
      if (0 < count) {
        lVar17 = (long)start;
        lVar20 = lVar17 << 5;
        do {
          pQVar6 = QList<QLayoutStruct>::data(chain);
          if (((&pQVar6->done)[lVar20] == false) &&
             (iVar15 = *(int *)((long)&pQVar6->sizeHint +
                               (ulong)(0 < *(int *)((long)&pQVar6->stretch + lVar20)) * 8 + lVar20),
             iVar15 <= *(int *)((long)&pQVar6->minimumSize + lVar20))) {
            *(int *)((long)&pQVar6->size + lVar20) = iVar15;
            (&pQVar6->done)[lVar20] = true;
            iVar11 = iVar11 + -1;
          }
          lVar17 = lVar17 + 1;
          lVar20 = lVar20 + 0x20;
        } while (lVar17 < iVar5);
      }
      if (iVar11 != 0) {
        iVar13 = (local_158 - space) + iVar13;
        do {
          if (count < 1) {
            bVar24 = true;
          }
          else {
            lVar22 = (long)iVar13;
            bVar24 = true;
            lVar10 = 0;
            lVar20 = (long)start << 5;
            lVar17 = (long)start;
            do {
              lVar17 = lVar17 + 1;
              pQVar6 = QList<QLayoutStruct>::data(chain);
              if ((&pQVar6->done)[lVar20] == false) {
                lVar7 = (lVar22 << 8) / (long)iVar11;
                uVar18 = lVar7 + lVar10;
                uVar19 = lVar7 + lVar10 + 0xff;
                if (-1 < (long)uVar18) {
                  uVar19 = uVar18;
                }
                iVar16 = (uint)(0x7f < (long)(uVar18 - (uVar19 & 0xffffffffffffff00))) +
                         (int)(uVar19 >> 8);
                iVar15 = *(int *)((long)&pQVar6->sizeHint +
                                 (ulong)(0 < *(int *)((long)&pQVar6->stretch + lVar20)) * 8 + lVar20
                                 );
                iVar14 = iVar15 - iVar16;
                *(int *)((long)&pQVar6->size + lVar20) = iVar14;
                lVar10 = uVar18 + (long)iVar16 * -0x100;
                iVar16 = *(int *)((long)&pQVar6->minimumSize + lVar20);
                if (iVar16 <= iVar14) goto LAB_002ecfcc;
                (&pQVar6->done)[lVar20] = true;
                *(int *)((long)&pQVar6->size + lVar20) = iVar16;
                iVar13 = (iVar13 - iVar15) + iVar16;
                iVar11 = iVar11 + -1;
                bVar24 = false;
                bVar3 = false;
              }
              else {
LAB_002ecfcc:
                bVar3 = true;
              }
            } while ((bVar3) && (lVar20 = lVar20 + 0x20, lVar17 < iVar5));
          }
        } while (!bVar24);
      }
      local_158 = 0;
    }
    else {
      local_158 = space - local_158;
      lVar17 = (long)start;
      lVar20 = (long)iVar5;
      local_138 = count;
      if (0 < count) {
        lVar22 = (long)start;
        lVar10 = lVar22 << 5;
        do {
          pQVar6 = QList<QLayoutStruct>::data(chain);
          if ((&pQVar6->done)[lVar10] == false) {
            iVar13 = *(int *)((long)&pQVar6->stretch + lVar10);
            iVar11 = *(int *)((long)&pQVar6->sizeHint + (ulong)(0 < iVar13) * 8 + lVar10);
            if ((*(int *)((long)&pQVar6->maximumSize + lVar10) <= iVar11) ||
               ((((bVar21 == 0 && ((&pQVar6->empty)[lVar10] == true)) && (iVar13 == 0)) &&
                ((&pQVar6->expansive)[lVar10] == false)))) {
              *(int *)((long)&pQVar6->size + lVar10) = iVar11;
              (&pQVar6->done)[lVar10] = true;
              local_158 = local_158 - iVar11;
              local_164 = local_164 - iVar13;
              uVar2 = uVar2 - (&pQVar6->expansive)[lVar10];
              local_138 = local_138 + -1;
            }
          }
          lVar22 = lVar22 + 1;
          lVar10 = lVar10 + 0x20;
        } while (lVar22 < lVar20);
      }
      lVar10 = lVar17 * 0x20;
      local_124 = local_158;
      do {
        if (count < 1) {
          iVar13 = 0;
          iVar11 = 0;
        }
        else {
          lVar23 = (long)local_124 * 0x100;
          lVar12 = 0;
          iVar11 = 0;
          iVar13 = 0;
          lVar22 = lVar10;
          lVar7 = lVar17;
          do {
            pQVar6 = QList<QLayoutStruct>::data(chain);
            if ((&pQVar6->done)[lVar22] == false) {
              if ((int)local_164 < 1) {
                if ((int)uVar2 < 1) {
                  lVar8 = lVar23 / (long)local_138;
                }
                else {
                  lVar8 = (long)((ulong)(&pQVar6->expansive)[lVar22] * lVar23) / (long)(ulong)uVar2;
                }
              }
              else {
                lVar8 = (*(int *)((long)&pQVar6->stretch + lVar22) * lVar23) /
                        (long)(ulong)local_164;
              }
              uVar18 = lVar8 + lVar12;
              uVar19 = lVar8 + 0xff + lVar12;
              if (-1 < (long)uVar18) {
                uVar19 = uVar18;
              }
              iVar16 = (uint)(0x7f < (long)(uVar18 - (uVar19 & 0xffffffffffffff00))) +
                       (int)(uVar19 >> 8);
              *(int *)((long)&pQVar6->size + lVar22) = iVar16;
              lVar12 = uVar18 + (long)iVar16 * -0x100;
              iVar15 = *(int *)((long)&pQVar6->sizeHint +
                               (ulong)(0 < *(int *)((long)&pQVar6->stretch + lVar22)) * 8 + lVar22);
              if (iVar16 < iVar15) {
                iVar11 = (iVar11 - iVar16) + iVar15;
                local_158 = 0;
              }
              else {
                iVar15 = *(int *)((long)&pQVar6->maximumSize + lVar22);
                local_158 = 0;
                if (iVar15 < iVar16) {
                  iVar13 = (iVar13 + iVar16) - iVar15;
                }
              }
            }
            lVar7 = lVar7 + 1;
            lVar22 = lVar22 + 0x20;
          } while (lVar7 < lVar20);
        }
        if (((0 < iVar11) && (iVar13 <= iVar11)) && (lVar22 = lVar10, lVar7 = lVar17, 0 < count)) {
          do {
            pQVar6 = QList<QLayoutStruct>::data(chain);
            if ((&pQVar6->done)[lVar22] == false) {
              iVar15 = *(int *)((long)&pQVar6->stretch + lVar22);
              iVar16 = *(int *)((long)&pQVar6->sizeHint + (ulong)(0 < iVar15) * 8 + lVar22);
              if (*(int *)((long)&pQVar6->size + lVar22) < iVar16) {
                *(int *)((long)&pQVar6->size + lVar22) = iVar16;
                (&pQVar6->done)[lVar22] = true;
                local_124 = local_124 - iVar16;
                local_164 = local_164 - iVar15;
                uVar2 = uVar2 - (&pQVar6->expansive)[lVar22];
                local_138 = local_138 + -1;
              }
            }
            lVar7 = lVar7 + 1;
            lVar22 = lVar22 + 0x20;
          } while (lVar7 < lVar20);
        }
        if (((0 < iVar13) && (iVar11 <= iVar13)) &&
           (lVar22 = lVar10 + 0x1c, lVar7 = lVar17, 0 < count)) {
          do {
            pQVar6 = QList<QLayoutStruct>::data(chain);
            if ((*(char *)((long)pQVar6 + lVar22 + -6) == '\0') &&
               (iVar15 = *(int *)((long)pQVar6 + lVar22 + -0x14),
               iVar15 < *(int *)((long)&pQVar6->stretch + lVar22))) {
              *(int *)((long)&pQVar6->stretch + lVar22) = iVar15;
              *(undefined1 *)((long)pQVar6 + lVar22 + -6) = 1;
              local_164 = local_164 - *(int *)((long)pQVar6 + lVar22 + -0x1c);
              local_124 = local_124 - iVar15;
              uVar2 = uVar2 - *(byte *)((long)pQVar6 + lVar22 + -8);
              local_138 = local_138 + -1;
            }
            lVar7 = lVar7 + 1;
            lVar22 = lVar22 + 0x20;
          } while (lVar7 < lVar20);
        }
      } while ((0 < local_138) && (iVar13 != iVar11));
      if (local_138 == 0) {
        local_158 = local_124;
      }
    }
  }
  local_158 = local_158 / (local_128 + 2);
  if (0 < count) {
    iVar13 = pos + local_158;
    lVar17 = (long)start;
    uVar19 = lVar17 << 5 | 0x1c;
    do {
      pQVar6 = QList<QLayoutStruct>::data(chain);
      *(int *)((long)pQVar6 + (uVar19 - 4)) = iVar13;
      iVar13 = iVar13 + *(int *)((long)&pQVar6->stretch + uVar19);
      if (*(char *)((long)pQVar6 + (uVar19 - 7)) == '\0') {
        iVar11 = local_104;
        if (local_104 < 0) {
          iVar11 = *(int *)((long)pQVar6 + (uVar19 - 0xc));
        }
        iVar13 = iVar13 + local_158 + iVar11;
      }
      lVar17 = lVar17 + 1;
      uVar19 = uVar19 + 0x20;
    } while (lVar17 < iVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qGeomCalc(QList<QLayoutStruct> &chain, int start, int count, int pos, int space, int spacer)
{
    int cHint = 0;
    int cMin = 0;
    int sumStretch = 0;
    int sumSpacing = 0;
    int expandingCount = 0;

    bool allEmptyNonstretch = true;
    int pendingSpacing = -1;
    int spacerCount = 0;
    int i;

    for (i = start; i < start + count; i++) {
        QLayoutStruct *data = &chain[i];

        data->done = false;
        cHint += data->smartSizeHint();
        cMin += data->minimumSize;
        sumStretch += data->stretch;
        if (!data->empty) {
            /*
                Using pendingSpacing, we ensure that the spacing for the last
                (non-empty) item is ignored.
            */
            if (pendingSpacing >= 0) {
                sumSpacing += pendingSpacing;
                ++spacerCount;
            }
            pendingSpacing = data->effectiveSpacer(spacer);
        }
        if (data->expansive)
            expandingCount++;
        allEmptyNonstretch = allEmptyNonstretch && data->empty && !data->expansive && data->stretch <= 0;
    }

    int extraspace = 0;

    if (space < cMin + sumSpacing) {
        /*
          Less space than minimumSize; take from the biggest first
        */

        int minSize = cMin + sumSpacing;

        // shrink the spacers proportionally
        if (spacer >= 0) {
            spacer = minSize > 0 ? spacer * space / minSize : 0;
            sumSpacing = spacer * spacerCount;
        }

        QVarLengthArray<int, 32> minimumSizes;
        minimumSizes.reserve(count);

        for (i = start; i < start + count; i++)
            minimumSizes << chain.at(i).minimumSize;

        std::sort(minimumSizes.begin(), minimumSizes.end());

        int space_left = space - sumSpacing;

        int sum = 0;
        int idx = 0;
        int space_used=0;
        int current = 0;
        while (idx < count && space_used < space_left) {
            current = minimumSizes.at(idx);
            space_used = sum + current * (count - idx);
            sum += current;
            ++idx;
        }
        --idx;
        int deficit = space_used - space_left;

        int items = count - idx;
        /*
         * If we truncate all items to "current", we would get "deficit" too many pixels. Therefore, we have to remove
         * deficit/items from each item bigger than maxval. The actual value to remove is deficitPerItem + remainder/items
         * "rest" is the accumulated error from using integer arithmetic.
        */
        int deficitPerItem = deficit/items;
        int remainder = deficit % items;
        int maxval = current - deficitPerItem;

        int rest = 0;
        for (i = start; i < start + count; i++) {
            int maxv = maxval;
            rest += remainder;
            if (rest >= items) {
                maxv--;
                rest-=items;
            }
            QLayoutStruct *data = &chain[i];
            data->size = qMin(data->minimumSize, maxv);
            data->done = true;
        }
    } else if (space < cHint + sumSpacing) {
        /*
          Less space than smartSizeHint(), but more than minimumSize.
          Currently take space equally from each, as in Qt 2.x.
          Commented-out lines will give more space to stretchier
          items.
        */
        int n = count;
        int space_left = space - sumSpacing;
        int overdraft = cHint - space_left;

        // first give to the fixed ones:
        for (i = start; i < start + count; i++) {
            QLayoutStruct *data = &chain[i];
            if (!data->done
                 && data->minimumSize >= data->smartSizeHint()) {
                data->size = data->smartSizeHint();
                data->done = true;
                space_left -= data->smartSizeHint();
                // sumStretch -= data->stretch;
                n--;
            }
        }
        bool finished = n == 0;
        while (!finished) {
            finished = true;
            Fixed64 fp_over = toFixed(overdraft);
            Fixed64 fp_w = 0;

            for (i = start; i < start+count; i++) {
                QLayoutStruct *data = &chain[i];
                if (data->done)
                    continue;
                // if (sumStretch <= 0)
                fp_w += fp_over / n;
                // else
                //    fp_w += (fp_over * data->stretch) / sumStretch;
                int w = fRound(fp_w);
                data->size = data->smartSizeHint() - w;
                fp_w -= toFixed(w); // give the difference to the next
                if (data->size < data->minimumSize) {
                    data->done = true;
                    data->size = data->minimumSize;
                    finished = false;
                    overdraft -= data->smartSizeHint() - data->minimumSize;
                    // sumStretch -= data->stretch;
                    n--;
                    break;
                }
            }
        }
    } else { // extra space
        int n = count;
        int space_left = space - sumSpacing;
        // first give to the fixed ones, and handle non-expansiveness
        for (i = start; i < start + count; i++) {
            QLayoutStruct *data = &chain[i];
            if (!data->done
                && (data->maximumSize <= data->smartSizeHint()
                    || (!allEmptyNonstretch && data->empty &&
                        !data->expansive && data->stretch == 0))) {
                data->size = data->smartSizeHint();
                data->done = true;
                space_left -= data->size;
                sumStretch -= data->stretch;
                 if (data->expansive)
                     expandingCount--;
                n--;
            }
        }
        extraspace = space_left;

        /*
          Do a trial distribution and calculate how much it is off.
          If there are more deficit pixels than surplus pixels, give
          the minimum size items what they need, and repeat.
          Otherwise give to the maximum size items, and repeat.

          Paul Olav Tvete has a wonderful mathematical proof of the
          correctness of this principle, but unfortunately this
          comment is too small to contain it.
        */
        int surplus, deficit;
        do {
            surplus = deficit = 0;
            Fixed64 fp_space = toFixed(space_left);
            Fixed64 fp_w = 0;
            for (i = start; i < start + count; i++) {
                QLayoutStruct *data = &chain[i];
                if (data->done)
                    continue;
                extraspace = 0;
                if (sumStretch > 0) {
                    fp_w += (fp_space * data->stretch) / sumStretch;
                } else if (expandingCount > 0) {
                    fp_w += (fp_space * (data->expansive ? 1 : 0)) / expandingCount;
                } else {
                    fp_w += fp_space * 1 / n;
                }
                int w = fRound(fp_w);
                data->size = w;
                fp_w -= toFixed(w); // give the difference to the next
                if (w < data->smartSizeHint()) {
                    deficit +=  data->smartSizeHint() - w;
                } else if (w > data->maximumSize) {
                    surplus += w - data->maximumSize;
                }
            }
            if (deficit > 0 && surplus <= deficit) {
                // give to the ones that have too little
                for (i = start; i < start+count; i++) {
                    QLayoutStruct *data = &chain[i];
                    if (!data->done && data->size < data->smartSizeHint()) {
                        data->size = data->smartSizeHint();
                        data->done = true;
                        space_left -= data->smartSizeHint();
                        sumStretch -= data->stretch;
                        if (data->expansive)
                            expandingCount--;
                        n--;
                    }
                }
            }
            if (surplus > 0 && surplus >= deficit) {
                // take from the ones that have too much
                for (i = start; i < start + count; i++) {
                    QLayoutStruct *data = &chain[i];
                    if (!data->done && data->size > data->maximumSize) {
                        data->size = data->maximumSize;
                        data->done = true;
                        space_left -= data->maximumSize;
                        sumStretch -= data->stretch;
                        if (data->expansive)
                            expandingCount--;
                        n--;
                    }
                }
            }
        } while (n > 0 && surplus != deficit);
        if (n == 0)
            extraspace = space_left;
    }

    /*
      As a last resort, we distribute the unwanted space equally
      among the spacers (counting the start and end of the chain). We
      could, but don't, attempt a sub-pixel allocation of the extra
      space.
    */
    int extra = extraspace / (spacerCount + 2);
    int p = pos + extra;
    for (i = start; i < start+count; i++) {
        QLayoutStruct *data = &chain[i];
        data->pos = p;
        p += data->size;
        if (!data->empty)
            p += data->effectiveSpacer(spacer) + extra;
    }

#ifdef QLAYOUT_EXTRA_DEBUG
    qDebug() << "qGeomCalc" << "start" << start <<  "count" << count <<  "pos" << pos
             <<  "space" << space <<  "spacer" << spacer;
    for (i = start; i < start + count; ++i) {
        qDebug() << i << ':' << chain[i].minimumSize << chain[i].smartSizeHint()
                 << chain[i].maximumSize << "stretch" << chain[i].stretch
                 << "empty" << chain[i].empty << "expansive" << chain[i].expansive
                 << "spacing" << chain[i].spacing;
        qDebug() << "result pos" << chain[i].pos << "size" << chain[i].size;
    }
#endif
}